

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaPValAttrNodeQNameValue
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaBasicItemPtr ownerItem,
              xmlAttrPtr attr,xmlChar *value,xmlChar **uri,xmlChar **local)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  char *pcVar3;
  xmlChar *pxVar4;
  xmlNsPtr pxVar5;
  xmlChar *unaff_RBX;
  undefined4 uStack_38;
  int len;
  
  value[0] = '\0';
  value[1] = '\0';
  value[2] = '\0';
  value[3] = '\0';
  value[4] = '\0';
  value[5] = '\0';
  value[6] = '\0';
  value[7] = '\0';
  *uri = (xmlChar *)0x0;
  iVar1 = xmlValidateQName((xmlChar *)attr,1);
  if (0 < iVar1) {
    pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,ownerItem,(xmlNodePtr)pxVar2,
               (xmlSchemaTypePtr)0x0,(char *)attr,(xmlChar *)0x0,(char *)0x0,
               (xmlChar *)CONCAT44(len,uStack_38),unaff_RBX);
    *uri = (xmlChar *)attr;
LAB_001928fb:
    return ctxt->err;
  }
  if (iVar1 < 0) {
    return -1;
  }
  pcVar3 = strchr((char *)attr,0x3a);
  if (pcVar3 != (char *)0x0) {
    pxVar4 = xmlSplitQName3((xmlChar *)attr,&len);
    *uri = pxVar4;
    pxVar4 = xmlDictLookup(ctxt->dict,pxVar4,-1);
    *uri = pxVar4;
    pxVar4 = xmlDictLookup(ctxt->dict,(xmlChar *)attr,len);
    pxVar5 = xmlSearchNs(*(xmlDocPtr *)(ownerItem + 4),(xmlNodePtr)ownerItem[2].dummy,pxVar4);
    if (pxVar5 != (xmlNsPtr)0x0) {
      pxVar4 = xmlDictLookup(ctxt->dict,pxVar5->href,-1);
      *(xmlChar **)value = pxVar4;
      return 0;
    }
    pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME);
    xmlSchemaPSimpleTypeErr
              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,ownerItem,(xmlNodePtr)pxVar2,
               (xmlSchemaTypePtr)0x0,(char *)attr,
               (xmlChar *)
               "The value \'%s\' of simple type \'xs:QName\' has no corresponding namespace declaration in scope"
               ,(char *)attr,(xmlChar *)CONCAT44(len,uStack_38),unaff_RBX);
    goto LAB_001928fb;
  }
  pxVar5 = xmlSearchNs(*(xmlDocPtr *)(ownerItem + 4),(xmlNodePtr)ownerItem[2].dummy,(xmlChar *)0x0);
  if (((pxVar5 == (xmlNsPtr)0x0) || (pxVar4 = pxVar5->href, pxVar4 == (xmlChar *)0x0)) ||
     (*pxVar4 == '\0')) {
    if ((schema->flags & 0x200) == 0) goto LAB_001929cb;
    pxVar4 = ctxt->targetNamespace;
  }
  else {
    pxVar4 = xmlDictLookup(ctxt->dict,pxVar4,-1);
  }
  *(xmlChar **)value = pxVar4;
LAB_001929cb:
  pxVar4 = xmlDictLookup(ctxt->dict,(xmlChar *)attr,-1);
  *uri = pxVar4;
  return 0;
}

Assistant:

static int
xmlSchemaPValAttrNodeQNameValue(xmlSchemaParserCtxtPtr ctxt,
				       xmlSchemaPtr schema,
				       xmlSchemaBasicItemPtr ownerItem,
				       xmlAttrPtr attr,
				       const xmlChar *value,
				       const xmlChar **uri,
				       const xmlChar **local)
{
    const xmlChar *pref;
    xmlNsPtr ns;
    int len, ret;

    *uri = NULL;
    *local = NULL;
    ret = xmlValidateQName(value, 1);
    if (ret > 0) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    ownerItem, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME),
	    NULL, value, NULL, NULL, NULL);
	*local = value;
	return (ctxt->err);
    } else if (ret < 0)
	return (-1);

    if (!strchr((char *) value, ':')) {
	ns = xmlSearchNs(attr->doc, attr->parent, NULL);
	if (ns && ns->href && ns->href[0])
	    *uri = xmlDictLookup(ctxt->dict, ns->href, -1);
	else if (schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) {
	    /* TODO: move XML_SCHEMAS_INCLUDING_CONVERT_NS to the
	    * parser context. */
	    /*
	    * This one takes care of included schemas with no
	    * target namespace.
	    */
	    *uri = ctxt->targetNamespace;
	}
	*local = xmlDictLookup(ctxt->dict, value, -1);
	return (0);
    }
    /*
    * At this point xmlSplitQName3 has to return a local name.
    */
    *local = xmlSplitQName3(value, &len);
    *local = xmlDictLookup(ctxt->dict, *local, -1);
    pref = xmlDictLookup(ctxt->dict, value, len);
    ns = xmlSearchNs(attr->doc, attr->parent, pref);
    if (ns == NULL) {
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    ownerItem, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_QNAME), NULL, value,
	    "The value '%s' of simple type 'xs:QName' has no "
	    "corresponding namespace declaration in scope", value, NULL);
	return (ctxt->err);
    } else {
        *uri = xmlDictLookup(ctxt->dict, ns->href, -1);
    }
    return (0);
}